

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.cpp
# Opt level: O2

void __thiscall
merlin::gibbs::write_solution
          (gibbs *this,ostream *out,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old2new,graphical_model *orig,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *dummies,
          int output_format)

{
  Type TVar1;
  long lVar2;
  long lVar3;
  mapped_type mVar4;
  ostream *poVar5;
  const_iterator cVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  runtime_error *this_00;
  size_t k_1;
  size_t k_3;
  size_t k;
  mapped_type mVar9;
  value vVar10;
  double dVar11;
  double dVar12;
  allocator local_89;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_88;
  string err_msg;
  
  if (output_format == 10) {
    TVar1 = (this->m_task).t_;
    if (TVar1 == MAP) {
      poVar5 = std::operator<<(out,"MAP");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      for (err_msg._M_dataplus._M_p = (pointer)0x0;
          err_msg._M_dataplus._M_p <
          (pointer)((long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          err_msg._M_dataplus._M_p = err_msg._M_dataplus._M_p + 1) {
        cVar6 = std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::find(&dummies->_M_t,(key_type *)&err_msg);
        if ((_Rb_tree_header *)cVar6._M_node == &(dummies->_M_t)._M_impl.super__Rb_tree_header) {
          std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::at(evidence,(key_type *)&err_msg);
          poVar5 = std::operator<<(out," ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        }
      }
    }
    else {
      if (TVar1 != MAR) {
        return;
      }
      local_88 = old2new;
      poVar5 = std::operator<<(out,"MAR");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      for (err_msg._M_dataplus._M_p = (pointer)0x0;
          err_msg._M_dataplus._M_p <
          (pointer)((long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          err_msg._M_dataplus._M_p = err_msg._M_dataplus._M_p + 1) {
        cVar6 = std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::find(&dummies->_M_t,(key_type *)&err_msg);
        if ((_Rb_tree_header *)cVar6._M_node == &(dummies->_M_t)._M_impl.super__Rb_tree_header) {
          dVar12 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)err_msg._M_dataplus._M_p];
          pmVar8 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::at(evidence,(key_type *)&err_msg);
          mVar4 = *pmVar8;
          poVar5 = std::operator<<(out," ");
          uVar7 = (ulong)dVar12;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          for (mVar9 = 0;
              ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) != mVar9;
              mVar9 = mVar9 + 1) {
            poVar5 = std::operator<<(out," ");
            lVar2 = *(long *)poVar5;
            lVar3 = *(long *)(lVar2 + -0x18);
            *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 8) = 6;
            dVar11 = 1.0;
            if (mVar4 != mVar9) {
              dVar11 = 0.0;
            }
            std::ostream::_M_insert<double>(dVar11);
          }
        }
      }
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  else {
    if (output_format != 0xb) {
      std::__cxx11::string::string((string *)&err_msg,"Unknown output format",&local_89);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&err_msg);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<(out,"{");
    std::operator<<(out," \"algorithm\" : \"gibbs\", ");
    poVar5 = std::operator<<(out," \"samples\" : ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,", ");
    TVar1 = (this->m_task).t_;
    if (TVar1 == MAP) {
      local_88 = old2new;
      std::operator<<(out," \"task\" : \"MAP\", ");
      poVar5 = std::operator<<(out," \"value\" : ");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 8) = 6;
      dVar12 = this->m_lb;
      vVar10 = factor::max(&orig->m_global_const);
      dVar11 = ::log(vVar10);
      poVar5 = std::ostream::_M_insert<double>(dVar11 + dVar12);
      std::operator<<(poVar5,", ");
      std::operator<<(out," \"status\" : \"true\", ");
      std::operator<<(out," \"solution\" : [ ");
      for (err_msg._M_dataplus._M_p = (pointer)0x0;
          err_msg._M_dataplus._M_p <
          (pointer)((long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          err_msg._M_dataplus._M_p = err_msg._M_dataplus._M_p + 1) {
        cVar6 = std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::find(&dummies->_M_t,(key_type *)&err_msg);
        if ((_Rb_tree_header *)cVar6._M_node == &(dummies->_M_t)._M_impl.super__Rb_tree_header) {
          std::operator<<(out,"{");
          poVar5 = std::operator<<(out," \"variable\" : ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,",");
          std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::at(evidence,(key_type *)&err_msg);
          poVar5 = std::operator<<(out," \"value\" : ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(out,"}");
          if (err_msg._M_dataplus._M_p !=
              (pointer)(((long)(orig->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(orig->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) + -1)) {
            std::operator<<(out,", ");
          }
        }
      }
    }
    else {
      if (TVar1 != MAR) {
        return;
      }
      local_88 = old2new;
      std::operator<<(out," \"task\" : \"MAR\", ");
      poVar5 = std::operator<<(out," \"value\" : ");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 8) = 6;
      dVar12 = this->m_lb;
      vVar10 = factor::max(&orig->m_global_const);
      dVar11 = ::log(vVar10);
      poVar5 = std::ostream::_M_insert<double>(dVar11 + dVar12);
      std::operator<<(poVar5,", ");
      std::operator<<(out," \"status\" : \"true\", ");
      std::operator<<(out," \"marginals\" : [ ");
      for (err_msg._M_dataplus._M_p = (pointer)0x0;
          err_msg._M_dataplus._M_p <
          (pointer)((long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(orig->m_vadj).
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          err_msg._M_dataplus._M_p = err_msg._M_dataplus._M_p + 1) {
        cVar6 = std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::find(&dummies->_M_t,(key_type *)&err_msg);
        if ((_Rb_tree_header *)cVar6._M_node == &(dummies->_M_t)._M_impl.super__Rb_tree_header) {
          dVar12 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)err_msg._M_dataplus._M_p];
          uVar7 = (ulong)dVar12;
          uVar7 = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
          std::operator<<(out,"{");
          poVar5 = std::operator<<(out," \"variable\" : ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,", ");
          poVar5 = std::operator<<(out," \"states\" : ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,", ");
          std::operator<<(out," \"probabilities\" : [");
          pmVar8 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::at(evidence,(key_type *)&err_msg);
          mVar4 = *pmVar8;
          for (mVar9 = 0; uVar7 != mVar9; mVar9 = mVar9 + 1) {
            lVar2 = *(long *)out;
            lVar3 = *(long *)(lVar2 + -0x18);
            *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 6;
            dVar12 = 1.0;
            if (mVar4 != mVar9) {
              dVar12 = 0.0;
            }
            std::ostream::_M_insert<double>(dVar12);
            if (uVar7 - 1 != mVar9) {
              std::operator<<(out,", ");
            }
          }
          std::operator<<(out,"] ");
          std::operator<<(out,"}");
          if (err_msg._M_dataplus._M_p !=
              (pointer)(((long)(orig->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(orig->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) + -1)) {
            std::operator<<(out,", ");
          }
        }
      }
    }
    std::operator<<(out,"] ");
  }
  return;
}

Assistant:

void gibbs::write_solution(std::ostream& out, const std::map<size_t, size_t>& evidence,
		const std::map<size_t, size_t>& old2new, const graphical_model& orig,
		const std::set<size_t>& dummies, int output_format) {

	if (output_format == MERLIN_OUTPUT_JSON) {
		out << "{";
		out << " \"algorithm\" : \"gibbs\", ";
		out << " \"samples\" : " << m_samples.size() << ", ";
		switch (m_task) {
		case Task::MAR:
			{
				out << " \"task\" : \"MAR\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"marginals\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					out << "{";
					out << " \"variable\" : " << v.label() << ", ";
					out << " \"states\" : " << v.states() << ", ";
					out << " \"probabilities\" : [";
					try { // evidence variable
						size_t val = evidence.at(i);
						for (size_t k = 0; k < v.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
							if (k != v.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						for (size_t k = 0; k < VX.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
							if (k != VX.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					}

					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				} // end for
				out << "] ";
				break;
			}
		case Task::MAP:
			{
				out << " \"task\" : \"MAP\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"solution\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					out << "{";
					out << " \"variable\" : " << i << ",";

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " \"value\" : " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " \"value\" : " << m_best_config[j];
					}
					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				}
				out << "] ";
				break;
			}
		default:
			break;
		} // end switch
	} else if (output_format == MERLIN_OUTPUT_UAI) {
		// Ouput marginals (ie, beliefs)
		switch (m_task) {
		case Task::MAR:
			{
				out << "MAR" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << v.states();
						for (size_t k = 0; k < v.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
						}
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						out << " " << VX.states();
						for (size_t k = 0; k < VX.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
						}
					}
				} // end for
				out << std::endl;
				break;
			}
		case Task::MAP:
			{
				out << "MAP" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " " << m_best_config[j];
					}
				}
				out << std::endl;
				break;
			}
		default:
			break;
		} // end switch
	} else {
		std::string err_msg("Unknown output format");
		throw std::runtime_error(err_msg);
	}
}